

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68020_cpscc(m68k_info *info)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((info->type & 0x1c) != 0) {
    MCInst_setOpcode(info->inst,200);
    (info->extension).op_count = '\x01';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x1;
    uVar3 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
    uVar2 = 0x2a;
    if (uVar3 + 2 <= info->code_len) {
      uVar2 = info->code[uVar3 + 1] & 0x2f;
    }
    info->pc = info->pc + 2;
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + uVar2;
    get_ea_mode_op(info,(info->extension).operands,info->ir,1);
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_cpscc(m68k_info *info)
{
	cs_m68k* ext;

	LIMIT_CPU_TYPES(info, M68020_PLUS);
	ext = build_init_op(info, M68K_INS_FSF, 1, 1);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (read_imm_16(info) & 0x2f);

	get_ea_mode_op(info, &ext->operands[0], info->ir, 1);
}